

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O1

void __thiscall pg::SSISolver::run(SSISolver *this)

{
  bitset *this_00;
  bitset *this_01;
  bitset *this_02;
  ulong *puVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  Game *pGVar4;
  uint64_t *puVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint *puVar9;
  int *piVar10;
  ostream *poVar11;
  Error *this_03;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  int iVar15;
  size_t sVar16;
  long lVar17;
  size_t sVar18;
  ulong uVar19;
  int iVar20;
  _label_vertex local_50;
  _label_vertex local_40;
  
  this_00 = &this->G;
  bitset::operator=(this_00,(this->super_Solver).disabled);
  uVar12 = (this->G)._bitssize;
  if (uVar12 != 0) {
    puVar2 = this_00->_bits;
    uVar13 = 0;
    do {
      puVar2[uVar13] = ~puVar2[uVar13];
      uVar13 = uVar13 + 1;
      uVar12 = (this->G)._bitssize;
    } while (uVar13 < uVar12);
  }
  uVar13 = (this->G)._size & 0x3f;
  if (uVar13 != 0) {
    this_00->_bits[uVar12 - 1] = this_00->_bits[uVar12 - 1] & ~(-1L << uVar13);
  }
  puVar2 = (this->G)._bits;
  sVar14 = (this->G)._bitssize;
  sVar18 = 0;
  do {
    sVar16 = sVar18;
    if (sVar14 == sVar16) {
      return;
    }
    sVar18 = sVar16 + 1;
  } while (puVar2[sVar16] == 0);
  if (sVar14 == sVar16) {
    return;
  }
  uVar12 = 0xffffffffffffffff;
  if (sVar14 != 0) {
    lVar17 = -(sVar14 << 0x26);
    do {
      lVar17 = lVar17 + 0x4000000000;
      uVar3 = puVar2[sVar14 - 1];
      if (uVar3 != 0) {
        uVar12 = (LZCOUNT(uVar3) << 0x20) - lVar17 >> 0x20 ^ 0x3f;
        break;
      }
      sVar14 = sVar14 - 1;
    } while (sVar14 != 0);
  }
  pGVar4 = (this->super_Solver).game;
  puVar9 = (this->Q).queue;
  this->k = pGVar4->_priority[uVar12] + 1;
  uVar12 = pGVar4->n_vertices;
  (this->Q).pointer = 0;
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
  }
  puVar9 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->Q).queue = puVar9;
  bitset::resize(&this->C,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->V,((this->super_Solver).game)->n_vertices);
  this_01 = &this->W0;
  bitset::resize(this_01,((this->super_Solver).game)->n_vertices);
  this_02 = &this->W1;
  bitset::resize(this_02,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->halt0,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->halt1,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->V0,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->V1,((this->super_Solver).game)->n_vertices);
  pGVar4 = (this->super_Solver).game;
  uVar12 = (long)this->k * pGVar4->n_vertices;
  piVar10 = (int *)operator_new__(-(ulong)(uVar12 >> 0x3e != 0) | uVar12 * 4);
  this->val = piVar10;
  piVar10 = (int *)operator_new__(-(ulong)((ulong)pGVar4->n_vertices >> 0x3e != 0) |
                                  pGVar4->n_vertices << 2);
  this->str0 = piVar10;
  piVar10 = (int *)operator_new__(-(ulong)((ulong)pGVar4->n_vertices >> 0x3e != 0) |
                                  pGVar4->n_vertices << 2);
  this->str1 = piVar10;
  piVar10 = (int *)operator_new__(-(ulong)((ulong)pGVar4->n_vertices >> 0x3e != 0) |
                                  pGVar4->n_vertices << 2);
  this->first_in = piVar10;
  piVar10 = (int *)operator_new__(-(ulong)((ulong)pGVar4->n_vertices >> 0x3e != 0) |
                                  pGVar4->n_vertices << 2);
  this->next_in = piVar10;
  for (uVar12 = bitset::find_first(this_00); uVar12 != 0xffffffffffffffff;
      uVar12 = bitset::find_next(this_00,uVar12)) {
    pGVar4 = (this->super_Solver).game;
    uVar19 = (ulong)(int)uVar12;
    uVar13 = 1L << (uVar12 & 0x3f);
    puVar1 = (&this->V0)[((pGVar4->_owner)._bits[uVar19 >> 6] >> (uVar12 & 0x3f) & 1) != 0]._bits +
             (uVar12 >> 6);
    *puVar1 = *puVar1 | uVar13;
    iVar15 = pGVar4->_outedges[pGVar4->_firstouts[uVar19]];
    if (iVar15 == -1) {
      iVar20 = -1;
    }
    else {
      piVar10 = pGVar4->_outedges + (long)pGVar4->_firstouts[uVar19] + 1;
      do {
        iVar20 = iVar15;
        if ((this_00->_bits[(ulong)(long)iVar15 >> 6] >> ((long)iVar15 & 0x3fU) & 1) != 0) break;
        iVar15 = *piVar10;
        piVar10 = piVar10 + 1;
        iVar20 = -1;
      } while (iVar15 != -1);
    }
    if (iVar20 == -1) {
      this_03 = (Error *)__cxa_allocate_exception(0x40);
      Error::Error(this_03,"logic error",
                   "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/ssi.cpp"
                   ,0x19a);
      __cxa_throw(this_03,&Error::typeinfo,Error::~Error);
    }
    if (1 < (this->super_Solver).trace) {
      poVar11 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"initial strategy: ",0x12);
      local_40.g = (this->super_Solver).game;
      local_40.v = (int)uVar12;
      poVar11 = operator<<(poVar11,&local_40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," => ",4);
      local_50.g = (this->super_Solver).game;
      local_50.v = iVar20;
      poVar11 = operator<<(poVar11,&local_50);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
    }
    this->str0[uVar12] = iVar20;
    this->str1[uVar12] = iVar20;
    puVar1 = (&this->halt0)[(*(byte *)(((this->super_Solver).game)->_priority + uVar19) & 1) == 0].
             _bits + (uVar12 >> 6);
    *puVar1 = *puVar1 | uVar13;
  }
  sVar14 = bitset::count(this_00);
  iVar15 = 0;
  iVar20 = 0;
  do {
    while( true ) {
      iVar20 = iVar20 + 1;
      if ((this->super_Solver).trace != 0) {
        poVar11 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"\x1b[1;38;5;208mMajor iteration ",0x1d);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar20);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\x1b[m",3);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      if ((this->super_Solver).trace != 0) {
        poVar11 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"Computing Odd\'s best response...",0x20);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      do {
        iVar15 = iVar15 + 1;
        compute_vals_ll(this,0);
        iVar7 = switch_opp_strategy(this,0);
      } while (iVar7 != 0);
      iVar7 = mark_solved(this,0);
      sVar14 = sVar14 - (long)iVar7;
      bVar6 = sVar14 == 0 ^ 9;
      if (iVar7 == 0) {
        bVar6 = 0;
      }
      if (bVar6 == 0) break;
LAB_0016008f:
      if (bVar6 != 9) goto LAB_001602b8;
    }
    if ((this->super_Solver).trace != 0) {
      poVar11 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"Computing Even\'s best response...",0x21);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
    }
    do {
      iVar15 = iVar15 + 1;
      compute_vals_ll(this,1);
      iVar7 = switch_opp_strategy(this,1);
    } while (iVar7 != 0);
    iVar7 = mark_solved(this,1);
    sVar14 = sVar14 - (long)iVar7;
    bVar6 = sVar14 == 0 ^ 9;
    if (iVar7 == 0) {
      bVar6 = 0;
    }
    if (bVar6 != 0) goto LAB_0016008f;
    if ((this->super_Solver).trace != 0) {
      poVar11 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"Improving Odd\'s strategy...",0x1b);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
    }
    iVar8 = switch_sym_strategy(this,1);
    iVar7 = (this->super_Solver).trace;
    if (iVar8 == 0) {
      if (iVar7 != 0) {
        poVar11 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"No (possible) improvements - Even wins remainder.",0x31);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      sVar14 = (this->W0)._bitssize;
      if (sVar14 != 0) {
        puVar2 = this_00->_bits;
        puVar5 = this_01->_bits;
        sVar18 = 0;
        do {
          puVar5[sVar18] = puVar5[sVar18] | puVar2[sVar18];
          sVar18 = sVar18 + 1;
        } while (sVar14 != sVar18);
      }
      for (sVar14 = bitset::find_first(this_00); sVar14 != 0xffffffffffffffff;
          sVar14 = bitset::find_next(this_00,sVar14)) {
        this->str0[sVar14] = this->str1[sVar14];
      }
      goto LAB_001602b8;
    }
    if (iVar7 != 0) {
      poVar11 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"Improving Even\'s strategy...",0x1c);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
    }
    compute_vals_ll(this,0);
    iVar7 = switch_sym_strategy(this,0);
  } while (iVar7 != 0);
  if ((this->super_Solver).trace != 0) {
    poVar11 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"No (possible) improvements - Odd wins remainder.",0x30);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  sVar14 = (this->W1)._bitssize;
  if (sVar14 != 0) {
    puVar2 = this_00->_bits;
    puVar5 = this_02->_bits;
    sVar18 = 0;
    do {
      puVar5[sVar18] = puVar5[sVar18] | puVar2[sVar18];
      sVar18 = sVar18 + 1;
    } while (sVar14 != sVar18);
  }
  for (sVar14 = bitset::find_first(this_00); sVar14 != 0xffffffffffffffff;
      sVar14 = bitset::find_next(this_00,sVar14)) {
    this->str1[sVar14] = this->str0[sVar14];
  }
LAB_001602b8:
  for (uVar12 = bitset::find_first(this_01); uVar12 != 0xffffffffffffffff;
      uVar12 = bitset::find_next(this_01,uVar12)) {
    iVar7 = -1;
    if (((((this->super_Solver).game)->_owner)._bits[(ulong)(long)(int)uVar12 >> 6] >>
         (uVar12 & 0x3f) & 1) == 0) {
      iVar7 = this->str0[uVar12];
    }
    Oink::solve((this->super_Solver).oink,(int)uVar12,0,iVar7);
  }
  for (uVar12 = bitset::find_first(this_02); uVar12 != 0xffffffffffffffff;
      uVar12 = bitset::find_next(this_02,uVar12)) {
    if (((((this->super_Solver).game)->_owner)._bits[(ulong)(long)(int)uVar12 >> 6] >>
         (uVar12 & 0x3f) & 1) == 0) {
      iVar7 = -1;
    }
    else {
      iVar7 = this->str1[uVar12];
    }
    Oink::solve((this->super_Solver).oink,(int)uVar12,1,iVar7);
  }
  if (this->val != (int *)0x0) {
    operator_delete__(this->val);
  }
  if (this->first_in != (int *)0x0) {
    operator_delete__(this->first_in);
  }
  if (this->next_in != (int *)0x0) {
    operator_delete__(this->next_in);
  }
  if (this->str0 != (int *)0x0) {
    operator_delete__(this->str0);
  }
  if (this->str1 != (int *)0x0) {
    operator_delete__(this->str1);
  }
  poVar11 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"solved with ",0xc);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," major iterations, ",0x13);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," minor iterations.",0x12);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  return;
}

Assistant:

void
SSISolver::run()
{
    // set G to the game
    G = disabled;
    G.flip();
    if (G.none()) return; // nothing to do

    // assume the game is ordered
    k = 1 + priority(G.find_last());

    Q.resize(nodecount());
    C.resize(nodecount());
    V.resize(nodecount());
    W0.resize(nodecount());
    W1.resize(nodecount());
    halt0.resize(nodecount());
    halt1.resize(nodecount());
    V0.resize(nodecount());
    V1.resize(nodecount());

    val = new int[k*nodecount()];
    str0 = new int[nodecount()];
    str1 = new int[nodecount()];

    first_in = new int[nodecount()];
    next_in = new int[nodecount()];

    // initialize the datastructure
    for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
        // set V0 or V1
        (owner(v) == 0 ? V0 : V1)[v] = true;
        // select first available edge
        int to = -1;
        for (auto curedge = outs(v); *curedge != -1; curedge++) {
            int u = *curedge;
            if (G[u]) {
                to = u;
                break;
            }
        }
        if (to == -1) LOGIC_ERROR;
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "initial strategy: " << label_vertex(v) << " => " << label_vertex(to) << std::endl;
        }
#endif
        // set initial strategy of <v> to <to>.
        str0[v] = to;
        str1[v] = to;
        // halt for the right player
        if (priority(v)&1) {
            // odd priority, so halt for even
            halt0[v] = true;
        } else {
            // even priority, so halt for odd
            halt1[v] = true;
        }
    }

    int minor = 0, major = 0;
    auto remaining = G.count();

    for (;;) {
        ++major;
        if (trace) {
            logger << "\033[1;38;5;208mMajor iteration " << major << "\033[m" << std::endl;
        }
        {
            // First compute Odd's best response for Even's strategy
            if (trace) logger << "Computing Odd's best response..." << std::endl;
            for (;;) {
                ++minor;
                compute_vals_ll(0);
                int count = switch_opp_strategy(0);
                if (count == 0) break; // if nothing left, done
            }
            int solved = mark_solved(0); // mark nodes won by Even after Odd's best response
            if (solved != 0) {
                remaining -= solved;
                if (remaining <= 0) break;
                continue; // restart major loop
            }
        }
        {
            // Now compute Even's best response for Odd's strategy
            if (trace) logger << "Computing Even's best response..." << std::endl;
            for (;;) {
                ++minor;
                compute_vals_ll(1);
                int count = switch_opp_strategy(1);
                if (count == 0) break; // if nothing left, done
            }
            int solved = mark_solved(1); // mark nodes won by Odd after Even's best response
            if (solved != 0) {
                remaining -= solved;
                if (remaining <= 0) break;
                continue; // restart major loop
            }
        }
        if (trace) logger << "Improving Odd's strategy..." << std::endl;
        if (switch_sym_strategy(1) == 0) {
            // Now all vertices not in a winning region are won by Even with strategy str1
            if (trace) logger << "No (possible) improvements - Even wins remainder." << std::endl;
            W0 |= G;
            for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
                str0[v] = str1[v];
            }
            break;
        }
        if (trace) logger << "Improving Even's strategy..." << std::endl;
        compute_vals_ll(0);
        if (switch_sym_strategy(0) == 0) {
            // Now all vertices not in a winning region are won by Odd with strategy str0
            if (trace) logger << "No (possible) improvements - Odd wins remainder." << std::endl;
            W1 |= G;
            for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
                str1[v] = str0[v];
            }
            break;
        }
    }

    for (auto v = W0.find_first(); v != bitset::npos; v = W0.find_next(v)) {
        Solver::solve(v, 0, owner(v) == 0 ? str0[v] : -1);
    }

    for (auto v = W1.find_first(); v != bitset::npos; v = W1.find_next(v)) {
        Solver::solve(v, 1, owner(v) == 1 ? str1[v] : -1);
    }

    delete[] val;
    delete[] first_in;
    delete[] next_in;
    delete[] str0;
    delete[] str1;

    logger << "solved with " << major << " major iterations, " << minor << " minor iterations." << std::endl;
}